

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

HttpHeaderId __thiscall kj::HttpHeaderTable::Builder::add(Builder *this,StringPtr name)

{
  RemoveConst<kj::StringPtr> **ppRVar1;
  HttpHeaderTable *pHVar2;
  _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  StringPtr *pSVar3;
  RemoveConst<kj::StringPtr> *pRVar4;
  __node_ptr __node;
  __node_ptr p_Var5;
  RemoveConst<kj::StringPtr> *pRVar6;
  char *pcVar7;
  ulong __code;
  key_type *__key;
  anon_unknown_36 *this_01;
  size_t newSize;
  __hash_code __n_elt;
  pointer __ptr;
  HttpHeaderId HVar8;
  StringPtr name_00;
  
  name_00.content.size_ = (char *)name.content.size_;
  this_01 = (anon_unknown_36 *)name.content.ptr;
  name_00.content.ptr = name_00.content.size_;
  anon_unknown_36::requireValidHeaderName(this_01,name_00);
  pHVar2 = (this->table).ptr;
  pRVar6 = (pHVar2->namesById).builder.pos;
  this_00 = (_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(pHVar2->idsByName).ptr;
  pSVar3 = (pHVar2->namesById).builder.ptr;
  __node = (__node_ptr)operator_new(0x28);
  (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  *(anon_unknown_36 **)
   &(__node->super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
    super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>._M_storage._M_storage
       = this_01;
  *(char **)((long)&(__node->
                    super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                    super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                    _M_storage._M_storage + 8) = name_00.content.size_;
  *(int *)((long)&(__node->
                  super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                  super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                  _M_storage._M_storage + 0x10) = (int)((ulong)((long)pRVar6 - (long)pSVar3) >> 4);
  if (this_01 + (long)name_00.content.size_ + -1 == this_01) {
    __code = 0x1505;
  }
  else {
    __code = 0x1505;
    pcVar7 = (char *)0x0;
    do {
      __code = (ulong)((byte)this_01[(long)pcVar7] & 0xffffffdf) ^ __code * 0x21;
      pcVar7 = pcVar7 + 1;
    } while (name_00.content.size_ + -1 != pcVar7);
  }
  __key = (key_type *)(__code % this_00->_M_bucket_count);
  __n_elt = __code;
  p_Var5 = std::
           _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node((_Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this_00->_M_buckets,this_00->_M_bucket_count,__key,(__hash_code)this_01
                         );
  if (p_Var5 == (__node_ptr)0x0) {
    std::
    _Hashtable<kj::StringPtr,_std::pair<const_kj::StringPtr,_unsigned_int>,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>,_std::__detail::_Select1st,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_insert_unique_node(this_00,(size_type)__key,__code,__node,__n_elt);
    pHVar2 = (this->table).ptr;
    pRVar6 = (pHVar2->namesById).builder.pos;
    if (pRVar6 == (pHVar2->namesById).builder.endPtr) {
      pRVar4 = (pHVar2->namesById).builder.ptr;
      newSize = 4;
      if (pRVar6 != pRVar4) {
        newSize = (long)pRVar6 - (long)pRVar4 >> 3;
      }
      Vector<kj::StringPtr>::setCapacity(&pHVar2->namesById,newSize);
      pRVar6 = (pHVar2->namesById).builder.pos;
    }
    (pRVar6->content).ptr = (char *)this_01;
    (pRVar6->content).size_ = (size_t)name_00.content.size_;
    ppRVar1 = &(pHVar2->namesById).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  else {
    operator_delete(__node,0x28);
    __node = p_Var5;
  }
  HVar8.id = *(undefined4 *)
              ((long)&(__node->
                      super__Hash_node_value<std::pair<const_kj::StringPtr,_unsigned_int>,_true>).
                      super__Hash_node_value_base<std::pair<const_kj::StringPtr,_unsigned_int>_>.
                      _M_storage._M_storage + 0x10);
  HVar8.table = (this->table).ptr;
  HVar8._12_4_ = 0;
  return HVar8;
}

Assistant:

HttpHeaderId HttpHeaderTable::Builder::add(kj::StringPtr name) {
  requireValidHeaderName(name);

  auto insertResult = table->idsByName->map.insert(std::make_pair(name, table->namesById.size()));
  if (insertResult.second) {
    table->namesById.add(name);
  }
  return HttpHeaderId(table, insertResult.first->second);
}